

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

ConfigBlockSymbol * __thiscall
slang::ast::Compilation::createConfigBlock
          (Compilation *this,Scope *scope,ConfigDeclarationSyntax *syntax)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  undefined4 uVar4;
  value_type_pointer ppVar5;
  size_t sVar6;
  group_type_pointer pgVar7;
  value_type_pointer ppVar8;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
  *ptVar9;
  pointer ppCVar10;
  int iVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *this_00;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *arrays_;
  bool bVar15;
  byte bVar16;
  ulong uVar17;
  uint64_t uVar18;
  SourceLibrary *pSVar19;
  SourceLibrary *pSVar20;
  Diagnostic *this_01;
  uint64_t uVar21;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
  *ptVar22;
  ConfigBlockSymbol *pCVar23;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
  *ppVar24;
  ulong uVar25;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
  *ptVar26;
  Scope *pSVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  value_type_pointer __y;
  ConfigBlockSymbol *sv;
  uint uVar32;
  pointer ppCVar33;
  Scope *pos0;
  pointer ppCVar34;
  uchar uVar35;
  uchar uVar38;
  uchar uVar39;
  byte bVar40;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  byte bVar46;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  byte bVar50;
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  byte bVar54;
  initializer_list<const_slang::ast::ConfigBlockSymbol_*> __l;
  locator res;
  try_emplace_args_t local_109;
  ConfigBlockSymbol *local_108;
  ConfigBlockSymbol *local_100;
  allocator_type local_f1;
  ConfigBlockSymbol *local_f0;
  undefined8 local_e8;
  uchar uStack_e0;
  uchar uStack_df;
  uchar uStack_de;
  byte bStack_dd;
  uchar uStack_dc;
  uchar uStack_db;
  uchar uStack_da;
  byte bStack_d9;
  vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  local_d8;
  ulong local_c0;
  uint64_t local_b8;
  Scope *local_b0;
  undefined8 local_a8;
  uchar uStack_a0;
  uchar uStack_9f;
  uchar uStack_9e;
  byte bStack_9d;
  uchar uStack_9c;
  uchar uStack_9b;
  uchar uStack_9a;
  byte bStack_99;
  locator local_98;
  group_type_pointer local_80;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  byte bStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  byte bStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  local_b0 = scope;
  local_108 = ConfigBlockSymbol::fromSyntax(scope,syntax);
  local_e8 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
              *)&this->configBySyntax;
  local_d8.
  super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(local_108->super_Symbol).originatingSyntax;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       local_d8.
       super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar29 = SUB168(auVar13 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar13 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar17 = uVar29 >> ((byte)(this->configBySyntax).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar29 & 0xff];
  ppVar5 = (this->configBySyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
           .arrays.elements_;
  uVar25 = (this->configBySyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
           .arrays.groups_size_mask;
  uVar28 = 0;
  uVar31 = uVar17;
  do {
    pgVar2 = (this->configBySyntax).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
             .arrays.groups_ + uVar31;
    local_48 = pgVar2->m[0].n;
    uStack_47 = pgVar2->m[1].n;
    uStack_46 = pgVar2->m[2].n;
    bStack_45 = pgVar2->m[3].n;
    uStack_44 = pgVar2->m[4].n;
    uStack_43 = pgVar2->m[5].n;
    uStack_42 = pgVar2->m[6].n;
    bStack_41 = pgVar2->m[7].n;
    uStack_40 = pgVar2->m[8].n;
    uStack_3f = pgVar2->m[9].n;
    uStack_3e = pgVar2->m[10].n;
    bStack_3d = pgVar2->m[0xb].n;
    uStack_3c = pgVar2->m[0xc].n;
    uStack_3b = pgVar2->m[0xd].n;
    uStack_3a = pgVar2->m[0xe].n;
    bStack_39 = pgVar2->m[0xf].n;
    uVar35 = (uchar)uVar4;
    auVar41[0] = -(local_48 == uVar35);
    uVar38 = (uchar)((uint)uVar4 >> 8);
    auVar41[1] = -(uStack_47 == uVar38);
    uVar39 = (uchar)((uint)uVar4 >> 0x10);
    auVar41[2] = -(uStack_46 == uVar39);
    bVar40 = (byte)((uint)uVar4 >> 0x18);
    auVar41[3] = -(bStack_45 == bVar40);
    auVar41[4] = -(uStack_44 == uVar35);
    auVar41[5] = -(uStack_43 == uVar38);
    auVar41[6] = -(uStack_42 == uVar39);
    auVar41[7] = -(bStack_41 == bVar40);
    auVar41[8] = -(uStack_40 == uVar35);
    auVar41[9] = -(uStack_3f == uVar38);
    auVar41[10] = -(uStack_3e == uVar39);
    auVar41[0xb] = -(bStack_3d == bVar40);
    auVar41[0xc] = -(uStack_3c == uVar35);
    auVar41[0xd] = -(uStack_3b == uVar38);
    auVar41[0xe] = -(uStack_3a == uVar39);
    auVar41[0xf] = -(bStack_39 == bVar40);
    for (uVar32 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe);
        local_100 = local_108, uVar32 != 0; uVar32 = uVar32 - 1 & uVar32) {
      iVar11 = 0;
      if (uVar32 != 0) {
        for (; (uVar32 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
        }
      }
      if ((SyntaxNode *)
          local_d8.
          super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          *(SyntaxNode **)((long)&ppVar5[uVar31 * 0xf].first + (ulong)(uint)(iVar11 << 4))) {
        ppVar24 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                   *)((long)&ppVar5[uVar31 * 0xf].first + (ulong)(uint)(iVar11 << 4));
        goto LAB_0080ec82;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar29 & 7] & bStack_39) == 0) break;
    lVar30 = uVar31 + uVar28;
    uVar28 = uVar28 + 1;
    uVar31 = lVar30 + 1U & uVar25;
  } while (uVar28 <= uVar25);
  if ((this->configBySyntax).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
      .size_ctrl.size <
      (this->configBySyntax).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              ((locator *)&local_98,local_e8,(arrays_type *)local_e8,uVar17,uVar29,
               (try_emplace_args_t *)&local_f0,(SyntaxNode **)&local_d8);
    psVar1 = &(this->configBySyntax).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
    ppVar24 = local_98.p;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              ((locator *)&local_98,local_e8,uVar29,(try_emplace_args_t *)&local_f0,
               (SyntaxNode **)&local_d8);
    ppVar24 = local_98.p;
  }
LAB_0080ec82:
  (ppVar24->first)._M_str = (char *)local_108;
  sVar6 = (syntax->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar6 != 0) {
    ppCVar33 = (syntax->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>
               ._M_ptr;
    local_a8 = (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               (ppCVar33 + sVar6);
    do {
      local_d8.
      super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*ppCVar33;
      auVar14._8_8_ = 0;
      auVar14._0_8_ =
           local_d8.
           super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
      uVar28 = SUB168(auVar14 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar14 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar17 = uVar28 >> ((byte)(this->configBySyntax).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                                .arrays.groups_size_index & 0x3f);
      uVar4 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar28 & 0xff];
      ppVar5 = (this->configBySyntax).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
               .arrays.elements_;
      uVar25 = (this->configBySyntax).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
               .arrays.groups_size_mask;
      uVar29 = 0;
      uVar31 = uVar17;
      do {
        pgVar2 = (this->configBySyntax).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                 .arrays.groups_ + uVar31;
        local_58 = pgVar2->m[0].n;
        uStack_57 = pgVar2->m[1].n;
        uStack_56 = pgVar2->m[2].n;
        bStack_55 = pgVar2->m[3].n;
        uStack_54 = pgVar2->m[4].n;
        uStack_53 = pgVar2->m[5].n;
        uStack_52 = pgVar2->m[6].n;
        bStack_51 = pgVar2->m[7].n;
        uStack_50 = pgVar2->m[8].n;
        uStack_4f = pgVar2->m[9].n;
        uStack_4e = pgVar2->m[10].n;
        bStack_4d = pgVar2->m[0xb].n;
        uStack_4c = pgVar2->m[0xc].n;
        uStack_4b = pgVar2->m[0xd].n;
        uStack_4a = pgVar2->m[0xe].n;
        bStack_49 = pgVar2->m[0xf].n;
        uVar35 = (uchar)uVar4;
        auVar42[0] = -(local_58 == uVar35);
        uVar38 = (uchar)((uint)uVar4 >> 8);
        auVar42[1] = -(uStack_57 == uVar38);
        uVar39 = (uchar)((uint)uVar4 >> 0x10);
        auVar42[2] = -(uStack_56 == uVar39);
        bVar40 = (byte)((uint)uVar4 >> 0x18);
        auVar42[3] = -(bStack_55 == bVar40);
        auVar42[4] = -(uStack_54 == uVar35);
        auVar42[5] = -(uStack_53 == uVar38);
        auVar42[6] = -(uStack_52 == uVar39);
        auVar42[7] = -(bStack_51 == bVar40);
        auVar42[8] = -(uStack_50 == uVar35);
        auVar42[9] = -(uStack_4f == uVar38);
        auVar42[10] = -(uStack_4e == uVar39);
        auVar42[0xb] = -(bStack_4d == bVar40);
        auVar42[0xc] = -(uStack_4c == uVar35);
        auVar42[0xd] = -(uStack_4b == uVar38);
        auVar42[0xe] = -(uStack_4a == uVar39);
        auVar42[0xf] = -(bStack_49 == bVar40);
        for (uVar32 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe); uVar32 != 0;
            uVar32 = uVar32 - 1 & uVar32) {
          iVar11 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
            }
          }
          if ((SyntaxNode *)
              local_d8.
              super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              *(SyntaxNode **)((long)&ppVar5[uVar31 * 0xf].first + (ulong)(uint)(iVar11 << 4))) {
            ppVar24 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                       *)((long)&ppVar5[uVar31 * 0xf].first + (ulong)(uint)(iVar11 << 4));
            goto LAB_0080edcf;
          }
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar28 & 7] & bStack_49) == 0)
        break;
        lVar30 = uVar31 + uVar29;
        uVar29 = uVar29 + 1;
        uVar31 = lVar30 + 1U & uVar25;
      } while (uVar29 <= uVar25);
      if ((this->configBySyntax).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
          .size_ctrl.size <
          (this->configBySyntax).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                  ((locator *)&local_98,local_e8,(arrays_type *)local_e8,uVar17,uVar28,
                   (try_emplace_args_t *)&local_f0,(SyntaxNode **)&local_d8);
        psVar1 = &(this->configBySyntax).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
        ppVar24 = local_98.p;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                  ((locator *)&local_98,local_e8,uVar28,(try_emplace_args_t *)&local_f0,
                   (SyntaxNode **)&local_d8);
        ppVar24 = local_98.p;
      }
LAB_0080edcf:
      (ppVar24->first)._M_str = (char *)local_108;
      ppCVar33 = ppCVar33 + 1;
    } while ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)ppCVar33 !=
             local_a8);
  }
  pCVar23 = local_108;
  if ((local_108->super_Symbol).name._M_len != 0) {
    sv = (ConfigBlockSymbol *)&(local_100->super_Symbol).name;
    local_a8 = (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               &this->configBlocks;
    uVar18 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                        local_a8,(basic_string_view<char,_std::char_traits<char>_> *)sv);
    uVar25 = uVar18 >> ((byte)(this->configBlocks).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                              .arrays.groups_size_index & 0x3f);
    lVar30 = (uVar18 & 0xff) * 4;
    uVar35 = (&UNK_0092f4ac)[lVar30];
    uVar38 = (&UNK_0092f4ad)[lVar30];
    uVar39 = (&UNK_0092f4ae)[lVar30];
    bVar40 = (&UNK_0092f4af)[lVar30];
    uVar21 = 0;
    uVar43 = uVar35;
    uVar44 = uVar38;
    uVar45 = uVar39;
    bVar46 = bVar40;
    uVar47 = uVar35;
    uVar48 = uVar38;
    uVar49 = uVar39;
    bVar50 = bVar40;
    uVar51 = uVar35;
    uVar52 = uVar38;
    uVar53 = uVar39;
    bVar54 = bVar40;
    local_100 = sv;
    do {
      this_00 = local_a8;
      pgVar7 = (this->configBlocks).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
               .arrays.groups_;
      pgVar3 = pgVar7 + uVar25;
      local_68 = pgVar3->m[0].n;
      uStack_67 = pgVar3->m[1].n;
      uStack_66 = pgVar3->m[2].n;
      bStack_65 = pgVar3->m[3].n;
      uStack_64 = pgVar3->m[4].n;
      uStack_63 = pgVar3->m[5].n;
      uStack_62 = pgVar3->m[6].n;
      bStack_61 = pgVar3->m[7].n;
      uStack_60 = pgVar3->m[8].n;
      uStack_5f = pgVar3->m[9].n;
      uStack_5e = pgVar3->m[10].n;
      bStack_5d = pgVar3->m[0xb].n;
      uStack_5c = pgVar3->m[0xc].n;
      uStack_5b = pgVar3->m[0xd].n;
      uStack_5a = pgVar3->m[0xe].n;
      bVar16 = pgVar3->m[0xf].n;
      auVar36[0] = -(local_68 == uVar35);
      auVar36[1] = -(uStack_67 == uVar38);
      auVar36[2] = -(uStack_66 == uVar39);
      auVar36[3] = -(bStack_65 == bVar40);
      auVar36[4] = -(uStack_64 == uVar43);
      auVar36[5] = -(uStack_63 == uVar44);
      auVar36[6] = -(uStack_62 == uVar45);
      auVar36[7] = -(bStack_61 == bVar46);
      auVar36[8] = -(uStack_60 == uVar47);
      auVar36[9] = -(uStack_5f == uVar48);
      auVar36[10] = -(uStack_5e == uVar49);
      auVar36[0xb] = -(bStack_5d == bVar50);
      auVar36[0xc] = -(uStack_5c == uVar51);
      auVar36[0xd] = -(uStack_5b == uVar52);
      auVar36[0xe] = -(uStack_5a == uVar53);
      auVar36[0xf] = -(bVar16 == bVar54);
      uVar32 = (uint)(ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe);
      bStack_59 = bVar16;
      if (uVar32 != 0) {
        local_e8 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
                    *)CONCAT17(bVar46,CONCAT16(uVar45,CONCAT15(uVar44,CONCAT14(uVar43,CONCAT13(
                                                  bVar40,CONCAT12(uVar39,CONCAT11(uVar38,uVar35)))))
                                              ));
        local_80 = pgVar7 + uVar25;
        ppVar8 = (this->configBlocks).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                 .arrays.elements_;
        uStack_e0 = uVar47;
        uStack_df = uVar48;
        uStack_de = uVar49;
        bStack_dd = bVar50;
        uStack_dc = uVar51;
        uStack_db = uVar52;
        uStack_da = uVar53;
        bStack_d9 = bVar54;
        local_c0 = uVar25;
        local_b8 = uVar21;
        do {
          uVar12 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
          __y = ppVar8 + uVar25 * 0xf + (ulong)uVar12;
          bVar15 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             (this_00,(basic_string_view<char,_std::char_traits<char>_> *)local_100,
                              &__y->first);
          pSVar27 = local_b0;
          if (bVar15) {
            pSVar19 = Symbol::getSourceLibrary(local_b0->thisSym);
            ppCVar34 = (__y->second).
                       super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppCVar10 = (__y->second).
                       super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            if (ppCVar34 == ppCVar10) goto LAB_0080f1ac;
            goto LAB_0080f14d;
          }
          uVar32 = uVar32 - 1 & uVar32;
        } while (uVar32 != 0);
        bVar16 = local_80->m[0xf].n;
        uVar21 = local_b8;
        pCVar23 = local_108;
        uVar25 = local_c0;
        sv = local_100;
        uVar35 = (uchar)local_e8;
        uVar38 = local_e8._1_1_;
        uVar39 = local_e8._2_1_;
        bVar40 = local_e8._3_1_;
        uVar43 = local_e8._4_1_;
        uVar44 = local_e8._5_1_;
        uVar45 = local_e8._6_1_;
        bVar46 = local_e8._7_1_;
        uVar47 = uStack_e0;
        uVar48 = uStack_df;
        uVar49 = uStack_de;
        bVar50 = bStack_dd;
        uVar51 = uStack_dc;
        uVar52 = uStack_db;
        uVar53 = uStack_da;
        bVar54 = bStack_d9;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bVar16) == 0) break;
      uVar31 = (this->configBlocks).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
               .arrays.groups_size_mask;
      lVar30 = uVar25 + uVar21;
      uVar21 = uVar21 + 1;
      uVar25 = lVar30 + 1U & uVar31;
    } while (uVar21 <= uVar31);
    __l._M_len = 1;
    __l._M_array = &local_f0;
    local_f0 = pCVar23;
    std::
    vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
    ::vector(&local_d8,__l,&local_f1);
    arrays_ = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)local_a8;
    uVar21 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                        local_a8,(basic_string_view<char,_std::char_traits<char>_> *)sv);
    pos0 = (Scope *)(uVar21 >> ((byte)*arrays_ & 0x3f));
    lVar30 = (uVar21 & 0xff) * 4;
    uVar35 = (&UNK_0092f4ac)[lVar30];
    uVar38 = (&UNK_0092f4ad)[lVar30];
    uVar39 = (&UNK_0092f4ae)[lVar30];
    bVar40 = (&UNK_0092f4af)[lVar30];
    uVar25 = (ulong)((uint)uVar21 & 7);
    ptVar22 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
               *)0x0;
    pSVar27 = pos0;
    uVar43 = uVar35;
    uVar44 = uVar38;
    uVar45 = uVar39;
    bVar46 = bVar40;
    uVar47 = uVar35;
    uVar48 = uVar38;
    uVar49 = uVar39;
    bVar50 = bVar40;
    uVar51 = uVar35;
    uVar52 = uVar38;
    uVar53 = uVar39;
    bVar54 = bVar40;
    do {
      pgVar7 = (this->configBlocks).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
               .arrays.groups_;
      pgVar3 = pgVar7 + (long)pSVar27;
      local_78 = pgVar3->m[0].n;
      uStack_77 = pgVar3->m[1].n;
      uStack_76 = pgVar3->m[2].n;
      bStack_75 = pgVar3->m[3].n;
      uStack_74 = pgVar3->m[4].n;
      uStack_73 = pgVar3->m[5].n;
      uStack_72 = pgVar3->m[6].n;
      bStack_71 = pgVar3->m[7].n;
      uStack_70 = pgVar3->m[8].n;
      uStack_6f = pgVar3->m[9].n;
      uStack_6e = pgVar3->m[10].n;
      bStack_6d = pgVar3->m[0xb].n;
      uStack_6c = pgVar3->m[0xc].n;
      uStack_6b = pgVar3->m[0xd].n;
      uStack_6a = pgVar3->m[0xe].n;
      bVar16 = pgVar3->m[0xf].n;
      auVar37[0] = -(local_78 == uVar35);
      auVar37[1] = -(uStack_77 == uVar38);
      auVar37[2] = -(uStack_76 == uVar39);
      auVar37[3] = -(bStack_75 == bVar40);
      auVar37[4] = -(uStack_74 == uVar43);
      auVar37[5] = -(uStack_73 == uVar44);
      auVar37[6] = -(uStack_72 == uVar45);
      auVar37[7] = -(bStack_71 == bVar46);
      auVar37[8] = -(uStack_70 == uVar47);
      auVar37[9] = -(uStack_6f == uVar48);
      auVar37[10] = -(uStack_6e == uVar49);
      auVar37[0xb] = -(bStack_6d == bVar50);
      auVar37[0xc] = -(uStack_6c == uVar51);
      auVar37[0xd] = -(uStack_6b == uVar52);
      auVar37[0xe] = -(uStack_6a == uVar53);
      auVar37[0xf] = -(bVar16 == bVar54);
      uVar32 = (uint)(ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe);
      bStack_69 = bVar16;
      if (uVar32 != 0) {
        local_a8 = (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   CONCAT17(bVar46,CONCAT16(uVar45,CONCAT15(uVar44,CONCAT14(uVar43,CONCAT13(bVar40,
                                                  CONCAT12(uVar39,CONCAT11(uVar38,uVar35)))))));
        ppVar8 = (this->configBlocks).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                 .arrays.elements_;
        local_e8 = ptVar22;
        local_c0 = uVar25;
        local_b8 = uVar21;
        local_b0 = pSVar27;
        uStack_a0 = uVar47;
        uStack_9f = uVar48;
        uStack_9e = uVar49;
        bStack_9d = bVar50;
        uStack_9c = uVar51;
        uStack_9b = uVar52;
        uStack_9a = uVar53;
        bStack_99 = bVar54;
        do {
          uVar12 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
          bVar15 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              arrays_,(basic_string_view<char,_std::char_traits<char>_> *)local_100,
                              &ppVar8[(long)pSVar27 * 0xf + (ulong)uVar12].first);
          if (bVar15) goto LAB_0080f10c;
          uVar32 = uVar32 - 1 & uVar32;
        } while (uVar32 != 0);
        bVar16 = pgVar7[(long)pSVar27].m[0xf].n;
        ptVar22 = local_e8;
        pSVar27 = local_b0;
        uVar25 = local_c0;
        uVar21 = local_b8;
        uVar35 = (uchar)local_a8;
        uVar38 = local_a8._1_1_;
        uVar39 = local_a8._2_1_;
        bVar40 = local_a8._3_1_;
        uVar43 = local_a8._4_1_;
        uVar44 = local_a8._5_1_;
        uVar45 = local_a8._6_1_;
        bVar46 = local_a8._7_1_;
        uVar47 = uStack_a0;
        uVar48 = uStack_9f;
        uVar49 = uStack_9e;
        bVar50 = bStack_9d;
        uVar51 = uStack_9c;
        uVar52 = uStack_9b;
        uVar53 = uStack_9a;
        bVar54 = bStack_99;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar25] & bVar16) == 0) break;
      ptVar9 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
                *)(this->configBlocks).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                  .arrays.groups_size_mask;
      ptVar26 = ptVar22 + (long)((long)&pSVar27->compilation + 1);
      ptVar22 = ptVar22 + 1;
      pSVar27 = (Scope *)((ulong)ptVar26 & (ulong)ptVar9);
    } while (ptVar22 <= ptVar9);
    if ((this->configBlocks).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
        .size_ctrl.size <
        (this->configBlocks).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>
                (&local_98,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
                  *)arrays_,(arrays_type *)arrays_,(size_t)pos0,uVar21,&local_109,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_100,&local_d8);
      psVar1 = &(this->configBlocks).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>
                (&local_98,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
                  *)arrays_,uVar21,&local_109,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_100,&local_d8);
    }
LAB_0080f10c:
    if ((SyntaxNode *)
        local_d8.
        super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (SyntaxNode *)0x0) {
      operator_delete(local_d8.
                      super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.
                            super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.
                            super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return local_108;
  while (ppCVar34 = ppCVar34 + 1, ppCVar34 != ppCVar10) {
LAB_0080f14d:
    pSVar20 = Symbol::getSourceLibrary(&(*ppCVar34)->super_Symbol);
    pCVar23 = local_108;
    if (pSVar20 == pSVar19) break;
  }
  if (ppCVar34 !=
      (__y->second).
      super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_01 = Scope::addDiag(pSVar27,(DiagCode)0x2a000a,(local_108->super_Symbol).location);
    Diagnostic::operator<<(this_01,(pCVar23->super_Symbol).name);
    Diagnostic::addNote(this_01,(DiagCode)0xa0001,((*ppCVar34)->super_Symbol).location);
    return pCVar23;
  }
LAB_0080f1ac:
  pCVar23 = local_108;
  local_98.pg = (group15<boost::unordered::detail::foa::plain_integral> *)local_108;
  std::
  vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>
  ::emplace_back<slang::ast::ConfigBlockSymbol*>
            ((vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>
              *)&__y->second,(ConfigBlockSymbol **)&local_98);
  return pCVar23;
}

Assistant:

const ConfigBlockSymbol& Compilation::createConfigBlock(const Scope& scope,
                                                        const ConfigDeclarationSyntax& syntax) {
    SLANG_ASSERT(!isFrozen());

    auto& config = ConfigBlockSymbol::fromSyntax(scope, syntax);

    // Register lookups by syntax node. Note that we register rule entries here
    // by looking directly at the syntax so that we don't trigger resolution
    // of the config block early, which could cause spurious errors.
    configBySyntax[config.getSyntax()] = &config;
    for (auto ruleSyntax : syntax.rules)
        configBySyntax[ruleSyntax] = &config;

    if (!config.name.empty()) {
        auto it = configBlocks.find(config.name);
        if (it == configBlocks.end()) {
            configBlocks.emplace(config.name, std::vector<const ConfigBlockSymbol*>{&config});
        }
        else {
            auto configLib = scope.asSymbol().getSourceLibrary();
            auto findIt = std::ranges::find_if(it->second, [&](const ConfigBlockSymbol* elem) {
                return elem->getSourceLibrary() == configLib;
            });

            if (findIt != it->second.end()) {
                auto& diag = scope.addDiag(diag::Redefinition, config.location);
                diag << config.name;
                diag.addNote(diag::NotePreviousDefinition, (*findIt)->location);
            }
            else {
                it->second.emplace_back(&config);
            }
        }
    }

    return config;
}